

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpat.cpp
# Opt level: O2

vm_obj_id_t CVmObjPattern::create_from_stack(uchar **pc_ptr,uint argc)

{
  re_status_t rVar1;
  vm_obj_id_t obj_id;
  re_compiled_pattern *in_RAX;
  ushort *puVar2;
  CVmObjPattern *this;
  re_compiled_pattern *pat;
  
  if (argc != 1) {
    err_throw(0x899);
  }
  pat = in_RAX;
  puVar2 = (ushort *)vm_val_t::get_as_string(sp_ + -1);
  if (puVar2 != (ushort *)0x0) {
    rVar1 = CRegexParser::compile_pattern
                      (G_bif_tads_globals_X->rex_parser,(char *)(puVar2 + 1),(ulong)*puVar2,&pat);
    if (rVar1 == RE_STATUS_SUCCESS) {
      obj_id = vm_new_id(0,1,0);
      this = (CVmObjPattern *)CVmObject::operator_new(0x10,obj_id);
      CVmObjPattern(this,pat,sp_ + -1);
      sp_ = sp_ + -1;
      return obj_id;
    }
    err_throw(0x900);
  }
  err_throw(0x7e3);
}

Assistant:

vm_obj_id_t CVmObjPattern::create_from_stack(VMG_ const uchar **pc_ptr,
                                             uint argc)
{
    const char *strval;
    re_status_t stat;
    re_compiled_pattern *pat;
    vm_obj_id_t id;

    /* check arguments */
    if (argc != 1)
        err_throw(VMERR_WRONG_NUM_OF_ARGS);

    /* retrieve the string, but leave it on the stack */
    strval = G_stk->get(0)->get_as_string(vmg0_);
    if (strval == 0)
        err_throw(VMERR_STRING_VAL_REQD);

    /* compile the string */
    stat = G_bif_tads_globals->rex_parser->compile_pattern(
        strval + VMB_LEN, vmb_get_len(strval), &pat);

    /* if we failed to compile the pattern, throw an error */
    if (stat != RE_STATUS_SUCCESS)
        err_throw(VMERR_BAD_TYPE_BIF);

    /* create a new pattern object to hold the pattern */
    id = vm_new_id(vmg_ FALSE, TRUE, FALSE);
    new (vmg_ id) CVmObjPattern(vmg_ pat, G_stk->get(0));

    /* discard arguments */
    G_stk->discard();

    /* return the new object */
    return id;
}